

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_settings.cpp
# Opt level: O3

shared_ptr<const_TestSettings> parse_settings(int param_1,char **argv)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  logic_error *this;
  long *plVar4;
  TestSettings *pTVar5;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_0000003c;
  char *i_option;
  shared_ptr<const_TestSettings> sVar6;
  int integer;
  int local_cc;
  TestSettings *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  undefined1 local_b8 [32];
  pointer local_98 [2];
  undefined1 local_88 [16];
  TestSettings local_78;
  
  local_b8._24_8_ = CONCAT44(in_register_0000003c,param_1);
  local_78._0_8_ = (pointer)0x101000100000000;
  local_78.m_queue_tests_cardinality = 2000;
  local_78.m_allocator_stress_test = true;
  local_78.m_run_only.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.m_run_only.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.m_run_only.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.m_exclude.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.m_exclude.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.m_exclude.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_cc = 0;
  if ((*in_RDX != 0) && (i_option = (char *)in_RDX[1], i_option != (char *)0x0)) {
    plVar4 = in_RDX + 1;
    do {
      bVar2 = anon_unknown.dwarf_14d1fcf::append_string_list(i_option,"-only:",&local_78.m_run_only)
      ;
      if (!bVar2) {
        bVar2 = anon_unknown.dwarf_14d1fcf::append_string_list
                          ((char *)*plVar4,"-exclude:",&local_78.m_exclude);
        if (!bVar2) {
          iVar3 = __isoc99_sscanf(*plVar4,"-rand_seed:%u",&local_78);
          if (iVar3 != 1) {
            iVar3 = __isoc99_sscanf(*plVar4,"-exceptions:%d",&local_cc);
            if (iVar3 == 1) {
              local_78.m_exceptions = local_cc != 0;
            }
            else {
              iVar3 = __isoc99_sscanf(*plVar4,"-spare_one_cpu:%d",&local_cc);
              if (iVar3 == 1) {
                local_78.m_spare_one_cpu = local_cc != 0;
              }
              else {
                iVar3 = __isoc99_sscanf(*plVar4,"-print_progress:%d",&local_cc);
                if (iVar3 == 1) {
                  local_78.m_print_progress = local_cc != 0;
                }
                else {
                  iVar3 = __isoc99_sscanf(*plVar4,"-test_allocators:%d",&local_cc);
                  if (iVar3 == 1) {
                    local_78.m_test_allocators = local_cc != 0;
                  }
                  else {
                    iVar3 = __isoc99_sscanf(*plVar4,"-queue_tests_cardinality:%zu",
                                            &local_78.m_queue_tests_cardinality);
                    if (iVar3 != 1) {
                      this = (logic_error *)__cxa_allocate_exception(0x10);
                      local_98[0] = (pointer)local_88;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_98,"Unrecognized commandline: ","");
                      plVar4 = (long *)std::__cxx11::string::append((char *)local_98);
                      local_c8 = (TestSettings *)*plVar4;
                      pTVar5 = (TestSettings *)(plVar4 + 2);
                      if (local_c8 == pTVar5) {
                        local_b8._0_4_ = pTVar5->m_rand_seed;
                        local_b8[4] = pTVar5->m_exceptions;
                        local_b8[5] = pTVar5->m_spare_one_cpu;
                        local_b8[6] = pTVar5->m_test_allocators;
                        local_b8[7] = pTVar5->m_print_progress;
                        local_b8._8_8_ = plVar4[3];
                        local_c8 = (TestSettings *)local_b8;
                      }
                      else {
                        local_b8._0_4_ = pTVar5->m_rand_seed;
                        local_b8[4] = pTVar5->m_exceptions;
                        local_b8[5] = pTVar5->m_spare_one_cpu;
                        local_b8[6] = pTVar5->m_test_allocators;
                        local_b8[7] = pTVar5->m_print_progress;
                      }
                      _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
                      *plVar4 = (long)pTVar5;
                      plVar4[1] = 0;
                      *(undefined1 *)(plVar4 + 2) = 0;
                      std::logic_error::logic_error(this,(string *)&local_c8);
                      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                    }
                  }
                }
              }
            }
          }
        }
      }
      i_option = (char *)plVar4[1];
      plVar4 = plVar4 + 1;
    } while (i_option != (char *)0x0);
  }
  local_c8 = (TestSettings *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TestSettings,std::allocator<TestSettings>,TestSettings&>
            (&_Stack_c0,&local_c8,(allocator<TestSettings> *)local_98,&local_78);
  uVar1 = local_b8._24_8_;
  *(TestSettings **)local_b8._24_8_ = local_c8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_b8._24_8_ + 8) = _Stack_c0._M_pi;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78.m_exclude);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78.m_run_only);
  sVar6.super___shared_ptr<const_TestSettings,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<const_TestSettings,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar1;
  return (shared_ptr<const_TestSettings>)
         sVar6.super___shared_ptr<const_TestSettings,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const TestSettings> parse_settings(int /*argc*/, char ** argv)
{
    TestSettings results;

    int integer = 0;

    if (*argv != nullptr && *++argv != nullptr)
    {
        for (auto parameter = argv; *parameter != nullptr; parameter++)
        {
            if (append_string_list(*parameter, "-only:", results.m_run_only))
            {
            }
            else if (append_string_list(*parameter, "-exclude:", results.m_exclude))
            {
            }
            else if (sscanf(*parameter, "-rand_seed:%" SCNu32, &results.m_rand_seed) == 1)
            {
            }
            else if (sscanf(*parameter, "-exceptions:%d", &integer) == 1)
            {
                results.m_exceptions = integer != 0;
            }
            else if (sscanf(*parameter, "-spare_one_cpu:%d", &integer) == 1)
            {
                results.m_spare_one_cpu = integer != 0;
            }
            else if (sscanf(*parameter, "-print_progress:%d", &integer) == 1)
            {
                results.m_print_progress = integer != 0;
            }
            else if (sscanf(*parameter, "-test_allocators:%d", &integer) == 1)
            {
                results.m_test_allocators = integer != 0;
            }
            else if (
              sscanf(
                *parameter, "-queue_tests_cardinality:%zu", &results.m_queue_tests_cardinality) ==
              1)
            {
            }
            else
            {
                throw std::logic_error(std::string("Unrecognized commandline: ") + *parameter);
            }
        }
    }
    return std::make_shared<TestSettings>(results);
}